

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

int dsa_sign_setup(DSA *dsa,BN_CTX *ctx,BIGNUM **out_kinv,BIGNUM **out_r)

{
  int iVar1;
  BN_MONT_CTX *pBVar2;
  BIGNUM *local_58;
  BIGNUM *kinv;
  BIGNUM *r;
  BIGNUM k;
  int ret;
  BIGNUM **out_r_local;
  BIGNUM **out_kinv_local;
  BN_CTX *ctx_local;
  DSA *dsa_local;
  
  k.flags = 0;
  BN_init((BIGNUM *)&r);
  kinv = (BIGNUM *)BN_new();
  local_58 = BN_new();
  if (((BIGNUM *)kinv != (BIGNUM *)0x0) && (local_58 != (BIGNUM *)0x0)) {
    iVar1 = BN_rand_range_ex((BIGNUM *)&r,1,dsa->q);
    if (iVar1 != 0) {
      pBVar2 = BN_MONT_CTX_set_locked(&dsa->method_mont_p,&dsa->method_mont_lock,dsa->p,ctx);
      if ((int)pBVar2 != 0) {
        pBVar2 = BN_MONT_CTX_set_locked(&dsa->method_mont_q,&dsa->method_mont_lock,dsa->q,ctx);
        if ((int)pBVar2 != 0) {
          iVar1 = BN_mod_exp_mont_consttime
                            ((BIGNUM *)kinv,(BIGNUM *)dsa->g,(BIGNUM *)&r,(BIGNUM *)dsa->p,
                             (BN_CTX *)ctx,(BN_MONT_CTX *)dsa->method_mont_p);
          if (iVar1 != 0) {
            bn_declassify(kinv);
            iVar1 = BN_div((BIGNUM *)0x0,(BIGNUM *)kinv,(BIGNUM *)kinv,(BIGNUM *)dsa->q,
                           (BN_CTX *)ctx);
            if (iVar1 != 0) {
              iVar1 = bn_mod_inverse_prime
                                ((BIGNUM *)local_58,(BIGNUM *)&r,dsa->q,ctx,dsa->method_mont_q);
              if (iVar1 != 0) {
                BN_clear_free((BIGNUM *)*out_kinv);
                *out_kinv = (BIGNUM *)local_58;
                local_58 = (BIGNUM *)0x0;
                BN_clear_free((BIGNUM *)*out_r);
                *out_r = kinv;
                kinv = (BIGNUM *)0x0;
                k.flags = 1;
                goto LAB_002db24c;
              }
            }
            ERR_put_error(10,0,3,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                          ,0x372);
            goto LAB_002db24c;
          }
        }
      }
    }
  }
  ERR_put_error(10,0,3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                ,0x363);
LAB_002db24c:
  BN_clear_free((BIGNUM *)&r);
  BN_clear_free((BIGNUM *)kinv);
  BN_clear_free(local_58);
  return k.flags;
}

Assistant:

static int dsa_sign_setup(const DSA *dsa, BN_CTX *ctx, BIGNUM **out_kinv,
                          BIGNUM **out_r) {
  int ret = 0;
  BIGNUM k;
  BN_init(&k);
  BIGNUM *r = BN_new();
  BIGNUM *kinv = BN_new();
  if (r == NULL || kinv == NULL ||
      // Get random k
      !BN_rand_range_ex(&k, 1, dsa->q) ||
      !BN_MONT_CTX_set_locked((BN_MONT_CTX **)&dsa->method_mont_p,
                              (CRYPTO_MUTEX *)&dsa->method_mont_lock, dsa->p,
                              ctx) ||
      !BN_MONT_CTX_set_locked((BN_MONT_CTX **)&dsa->method_mont_q,
                              (CRYPTO_MUTEX *)&dsa->method_mont_lock, dsa->q,
                              ctx) ||
      // Compute r = (g^k mod p) mod q
      !BN_mod_exp_mont_consttime(r, dsa->g, &k, dsa->p, ctx,
                                 dsa->method_mont_p)) {
    OPENSSL_PUT_ERROR(DSA, ERR_R_BN_LIB);
    goto err;
  }
  // Note |BN_mod| below is not constant-time and may leak information about
  // |r|. |dsa->p| may be significantly larger than |dsa->q|, so this is not
  // easily performed in constant-time with Montgomery reduction.
  //
  // However, |r| at this point is g^k (mod p). It is almost the value of |r|
  // revealed in the signature anyway (g^k (mod p) (mod q)), going from it to
  // |k| would require computing a discrete log.
  bn_declassify(r);
  if (!BN_mod(r, r, dsa->q, ctx) ||
      // Compute part of 's = inv(k) (m + xr) mod q' using Fermat's Little
      // Theorem.
      !bn_mod_inverse_prime(kinv, &k, dsa->q, ctx, dsa->method_mont_q)) {
    OPENSSL_PUT_ERROR(DSA, ERR_R_BN_LIB);
    goto err;
  }

  BN_clear_free(*out_kinv);
  *out_kinv = kinv;
  kinv = NULL;

  BN_clear_free(*out_r);
  *out_r = r;
  r = NULL;

  ret = 1;

err:
  BN_clear_free(&k);
  BN_clear_free(r);
  BN_clear_free(kinv);
  return ret;
}